

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

QList<int> *
waitForValue<QList<int>>
          (QList<int> *__return_storage_ptr__,QPromise<QList<int>_> *promise,QList<int> *initial)

{
  QPromise<void> local_48;
  QPromiseBase<void> local_38;
  undefined1 local_21;
  QList<int> *local_20;
  QList<int> *initial_local;
  QPromise<QList<int>_> *promise_local;
  QList<int> *value;
  
  local_21 = 0;
  local_20 = initial;
  initial_local = (QList<int> *)promise;
  promise_local = (QPromise<QList<int>_> *)__return_storage_ptr__;
  QList<int>::QList(__return_storage_ptr__,initial);
  QtPromise::QPromiseBase<QList<int>>::
  then<waitForValue<QList<int>>(QtPromise::QPromise<QList<int>>const&,QList<int>const&)::_lambda(QList<int>const&)_1_>
            ((QPromiseBase<QList<int>> *)&local_48,(anon_class_8_1_a8c68091 *)initial_local);
  QtPromise::QPromiseBase<void>::wait(&local_38,&local_48);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_38);
  QtPromise::QPromise<void>::~QPromise(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static inline T waitForValue(const QtPromise::QPromise<T>& promise, const T& initial)
{
    T value(initial);
    promise
        .then([&](const T& res) {
            value = res;
        })
        .wait();
    return value;
}